

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationsTest::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,VertexAttribLocationsTest *this,GLuint param_1,
          ProgramInterface *param_2,STAGES stage)

{
  STAGES stage_local;
  ProgramInterface *param_2_local;
  GLuint param_1_local;
  VertexAttribLocationsTest *this_local;
  string *verification;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (stage == VERTEX) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "if ((gl_VertexID   != vertex_index)  ||\n        (gl_InstanceID != instance_index) )\n    {\n        result = 0u;\n    }\n"
              );
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VertexAttribLocationsTest::getVerificationSnippet(GLuint /* test_case_index */,
															  Utils::ProgramInterface& /* program_interface */,
															  Utils::Shader::STAGES stage)
{
	std::string verification;

	if (Utils::Shader::VERTEX == stage)
	{

#if DEBUG_VERTEX_ATTRIB_LOCATIONS_TEST_VARIABLE

		verification = "if (gl_InstanceID != instance_index)\n"
					   "    {\n"
					   "        result = 12u;\n"
					   "    }\n"
					   "    else if (gl_VertexID != vertex_index)\n"
					   "    {\n"
					   "        result = 11u;\n"
					   "    }\n";

#else

		verification = "if ((gl_VertexID   != vertex_index)  ||\n"
					   "        (gl_InstanceID != instance_index) )\n"
					   "    {\n"
					   "        result = 0u;\n"
					   "    }\n";

#endif
	}
	else
	{
		verification = "";
	}

	return verification;
}